

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O0

void __thiscall GlobOpt::TailDupPass(GlobOpt *this)

{
  BasicBlock *pBVar1;
  code *pcVar2;
  FlowEdge **this_00;
  bool bVar3;
  BasicBlock *pBVar4;
  SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *pSVar5;
  undefined4 *puVar6;
  Type_conflict node;
  Type *ppFVar7;
  Instr *pIVar8;
  BranchInstr *tailBranch;
  BasicBlock *pred;
  FlowEdge **__edge;
  Iterator __iter;
  BasicBlock *loopTail;
  BasicBlock *header;
  Loop *loop;
  Loop *loopNext;
  GlobOpt *this_local;
  
  header = (BasicBlock *)this->func->m_fg->loopList;
  do {
    if (header == (BasicBlock *)0x0) {
      return;
    }
    pBVar1 = (BasicBlock *)header->typesNeedingKnownObjectLayout;
    pBVar4 = Loop::GetHeadBlock((Loop *)header);
    __iter.current = (NodeBase *)0x0;
    pSVar5 = &BasicBlock::GetPredList(pBVar4)->
              super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>;
    ___edge = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::GetIterator(pSVar5);
    do {
      if (__iter.list == (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                           ,0x76,"(current != nullptr)","current != nullptr");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
      this_00 = __edge;
      node = SListNodeBase<Memory::ArenaAllocator>::Next
                       (&(__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>);
      bVar3 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::IsHead
                        ((SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)this_00,node);
      pBVar4 = (BasicBlock *)__iter.current;
      if (bVar3) break;
      SListNodeBase<Memory::ArenaAllocator>::Next
                (&(__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>);
      ppFVar7 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                          ((Iterator *)&__edge);
      pBVar4 = FlowEdge::GetPred(*ppFVar7);
      if (pBVar4 == (BasicBlock *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x2da,"(pred)","pred");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
      bVar3 = Loop::IsDescendentOrSelf((Loop *)header,pBVar4->loop);
    } while (!bVar3);
    __iter.current = (NodeBase *)pBVar4;
    header = pBVar1;
    if (__iter.current != (NodeBase *)0x0) {
      pIVar8 = BasicBlock::GetLastInstr((BasicBlock *)__iter.current);
      bVar3 = IR::Instr::IsBranchInstr(pIVar8);
      if (!bVar3) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x2e5,"(loopTail->GetLastInstr()->IsBranchInstr())",
                           "LastInstr of loop should always be a branch no?");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
      pSVar5 = &BasicBlock::GetPredList((BasicBlock *)__iter.current)->
                super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>;
      bVar3 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::HasOne(pSVar5);
      if (!bVar3) {
        pIVar8 = BasicBlock::GetLastInstr((BasicBlock *)__iter.current);
        tailBranch = IR::Instr::AsBranchInstr(pIVar8);
        TryTailDup(this,tailBranch);
      }
    }
  } while( true );
}

Assistant:

void
GlobOpt::TailDupPass()
{
    FOREACH_LOOP_IN_FUNC_EDITING(loop, this->func)
    {
        BasicBlock* header = loop->GetHeadBlock();
        BasicBlock* loopTail = nullptr;
        FOREACH_PREDECESSOR_BLOCK(pred, header)
        {
            if (loop->IsDescendentOrSelf(pred->loop))
            {
                loopTail = pred;
                break;
            }
        } NEXT_PREDECESSOR_BLOCK;

        if (loopTail)
        {
            AssertMsg(loopTail->GetLastInstr()->IsBranchInstr(), "LastInstr of loop should always be a branch no?");

            if (!loopTail->GetPredList()->HasOne())
            {
                TryTailDup(loopTail->GetLastInstr()->AsBranchInstr());
            }
        }
    } NEXT_LOOP_IN_FUNC_EDITING;
}